

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

value_type * __thiscall
QList<SafeSymbols>::takeLast(value_type *__return_storage_ptr__,QList<SafeSymbols> *this)

{
  qsizetype qVar1;
  Data *pDVar2;
  Data *pDVar3;
  Symbol *pSVar4;
  Data *pDVar5;
  char *pcVar6;
  iterator iVar7;
  
  iVar7 = end(this);
  pDVar3 = iVar7.i[-1].symbols.d.d;
  pSVar4 = iVar7.i[-1].symbols.d.ptr;
  iVar7.i[-1].symbols.d.d = (Data *)0x0;
  iVar7.i[-1].symbols.d.ptr = (Symbol *)0x0;
  (__return_storage_ptr__->symbols).d.d = pDVar3;
  (__return_storage_ptr__->symbols).d.ptr = pSVar4;
  qVar1 = iVar7.i[-1].symbols.d.size;
  iVar7.i[-1].symbols.d.size = 0;
  (__return_storage_ptr__->symbols).d.size = qVar1;
  pDVar5 = iVar7.i[-1].expandedMacro.d.d;
  pcVar6 = iVar7.i[-1].expandedMacro.d.ptr;
  iVar7.i[-1].expandedMacro.d.d = (Data *)0x0;
  iVar7.i[-1].expandedMacro.d.ptr = (char *)0x0;
  (__return_storage_ptr__->expandedMacro).d.d = pDVar5;
  (__return_storage_ptr__->expandedMacro).d.ptr = pcVar6;
  qVar1 = iVar7.i[-1].expandedMacro.d.size;
  iVar7.i[-1].expandedMacro.d.size = 0;
  (__return_storage_ptr__->expandedMacro).d.size = qVar1;
  pDVar2 = iVar7.i[-1].excludedSymbols.q_hash.d;
  iVar7.i[-1].excludedSymbols.q_hash.d = (Data *)0x0;
  (__return_storage_ptr__->excludedSymbols).q_hash.d = pDVar2;
  __return_storage_ptr__->index = iVar7.i[-1].index;
  QtPrivate::QGenericArrayOps<SafeSymbols>::eraseLast((QGenericArrayOps<SafeSymbols> *)this);
  return __return_storage_ptr__;
}

Assistant:

value_type takeLast() { Q_ASSERT(!isEmpty()); value_type v = std::move(last()); d->eraseLast(); return v; }